

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O0

void update_volumes(YMZ280BVoice *voice)

{
  int local_14;
  YMZ280BVoice *voice_local;
  
  if (voice->pan == '\b') {
    voice->output_left = (uint)voice->level;
    voice->output_right = (uint)voice->level;
  }
  else if (voice->pan < 8) {
    voice->output_left = (uint)voice->level;
    if (voice->pan == '\0') {
      local_14 = 0;
    }
    else {
      local_14 = (int)((uint)voice->level * (voice->pan - 1)) / 7;
    }
    voice->output_right = local_14;
  }
  else {
    voice->output_left = (int)((uint)voice->level * (0xf - (uint)voice->pan)) / 7;
    voice->output_right = (uint)voice->level;
  }
  return;
}

Assistant:

INLINE void update_volumes(struct YMZ280BVoice *voice)
{
	if (voice->pan == 8)
	{
		voice->output_left = voice->level;
		voice->output_right = voice->level;
	}
	else if (voice->pan < 8)
	{
		voice->output_left = voice->level;

		/* pan 1 is hard-left, what's pan 0? for now assume same as pan 1 */
		voice->output_right = (voice->pan == 0) ? 0 : voice->level * (voice->pan - 1) / 7;
	}
	else
	{
		voice->output_left = voice->level * (15 - voice->pan) / 7;
		voice->output_right = voice->level;
	}
}